

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_trie.c
# Opt level: O0

int ngram_model_trie_write_bin(ngram_model_t *base,char *path)

{
  undefined4 local_3c;
  FILE *pFStack_38;
  uint32 count;
  FILE *fp;
  ngram_model_trie_t *model;
  int32 is_pipe;
  int i;
  char *path_local;
  ngram_model_t *base_local;
  
  fp = (FILE *)base;
  _is_pipe = path;
  path_local = (char *)base;
  pFStack_38 = (FILE *)fopen_comp(path,"wb",(int32 *)&model);
  if (pFStack_38 == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
            ,0x1a9,"Unable to open %s to write binary trie LM\n",_is_pipe);
    base_local._4_4_ = -1;
  }
  else {
    fwrite("Trie Language Model",1,0x13,pFStack_38);
    fwrite(&fp->_IO_read_base,1,1,pFStack_38);
    for (model._4_4_ = 0; model._4_4_ < (int)(uint)*(byte *)&fp->_IO_read_base;
        model._4_4_ = model._4_4_ + 1) {
      local_3c = *(undefined4 *)(fp->_IO_read_ptr + (long)model._4_4_ * 4);
      fwrite(&local_3c,4,1,pFStack_38);
    }
    lm_trie_write_bin((lm_trie_t *)fp->_markers,**(uint32 **)(path_local + 8),(FILE *)pFStack_38);
    write_word_str((FILE *)pFStack_38,(ngram_model_t *)path_local,0);
    fclose_comp((FILE *)pFStack_38,(int32)model);
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

int
ngram_model_trie_write_bin(ngram_model_t * base, const char *path)
{
    int i;
    int32 is_pipe;
    ngram_model_trie_t *model = (ngram_model_trie_t *) base;
    FILE *fp = fopen_comp(path, "wb", &is_pipe);
    if (!fp) {
        E_ERROR("Unable to open %s to write binary trie LM\n", path);
        return -1;
    }

    fwrite(trie_hdr, sizeof(*trie_hdr), strlen(trie_hdr), fp);
    fwrite(&model->base.n, sizeof(model->base.n), 1, fp);
    for (i = 0; i < model->base.n; i++) {
        uint32 count = model->base.n_counts[i];
        if (SWAP_LM_TRIE)
            SWAP_INT32(&count);
        fwrite(&count, sizeof(count), 1, fp);
    }
    lm_trie_write_bin(model->trie, base->n_counts[0], fp);
    write_word_str(fp, base, SWAP_LM_TRIE);
    fclose_comp(fp, is_pipe);
    return 0;
}